

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmj02tables.h
# Opt level: O0

Point2f pbrt::GetPMJ02BNSample(int setIndex,int sampleIndex)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  int in_ESI;
  int in_EDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  Tuple2<pbrt::Point2,_float> local_8;
  
  iVar2 = in_ESI % 0x10000;
  lVar3 = (long)(in_EDI % 5) * 0x80000;
  auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,
                              *(undefined4 *)(pmj02bnSamples + (long)iVar2 * 8 + lVar3));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = auVar1._0_8_ * 2.3283064365386963e-10;
  vcvtusi2sd_avx512f(auVar4,*(undefined4 *)(lVar3 + 0x2e06d54 + (long)iVar2 * 8));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_EDI % 5,iVar2),in_stack_ffffffffffffffec,
             in_stack_ffffffffffffffe8);
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
inline Point2f GetPMJ02BNSample(int setIndex, int sampleIndex) {
    setIndex %= nPMJ02bnSets;
    DCHECK_LT(sampleIndex, nPMJ02bnSamples);
    sampleIndex %= nPMJ02bnSamples;

    // Convert from fixed-point.
#ifdef PBRT_IS_GPU_CODE
    return Point2f(pmj02bnSamples[setIndex][sampleIndex][0] * 0x1p-32f,
                   pmj02bnSamples[setIndex][sampleIndex][1] * 0x1p-32f);
#else
    // Double precision is key here for the pixel sample sorting, but not
    // necessary otherwise.
    return Point2f(pmj02bnSamples[setIndex][sampleIndex][0] * 0x1p-32,
                   pmj02bnSamples[setIndex][sampleIndex][1] * 0x1p-32);
#endif
}